

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O3

bool __thiscall SocketInternals::SetMulticastIP(SocketInternals *this,string *multicast)

{
  uint in_EAX;
  unsigned_long ret;
  in_addr local_18 [2];
  
  local_18[0].s_addr = in_EAX;
  inet_pton(2,(multicast->_M_dataplus)._M_p,local_18);
  if ((local_18[0].s_addr & 0xf0) == 0xe0) {
    (this->ServerAddrBroadcast).sin_addr.s_addr = local_18[0].s_addr;
  }
  return (local_18[0].s_addr & 0xf0) == 0xe0;
}

Assistant:

bool SocketInternals::SetMulticastIP(const std::string &multicast)
{
    unsigned long s_addr_new = EthUdpPort::IP_ULong(multicast);
    unsigned long first_byte = s_addr_new & 0x000000ff;
    if ((first_byte >= 224) && (first_byte <= 239)) {
        ServerAddrBroadcast.sin_addr.s_addr = s_addr_new;
        return true;
    }
    return false;
}